

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_resize.c
# Opt level: O2

int cvBuildNordsieckArrayBDF
              (sunrealtype *t,N_Vector *y,N_Vector f,N_Vector *wrk,int order,sunrealtype hscale,
              N_Vector *zn)

{
  N_Vector *pp_Var1;
  double dVar2;
  undefined4 in_EAX;
  int i;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  sunrealtype *psVar6;
  int j;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  int i_1;
  double dVar10;
  undefined1 auVar11 [16];
  sunrealtype local_70;
  sunrealtype t_ext [6];
  
  auVar11._0_4_ = -(uint)(t == (sunrealtype *)0x0);
  auVar11._4_4_ = -(uint)(y == (N_Vector *)0x0);
  auVar11._8_4_ = -(uint)(f == (N_Vector)0x0);
  auVar11._12_4_ = -(uint)(wrk == (N_Vector *)0x0);
  iVar3 = movmskps(in_EAX,auVar11);
  if ((zn == (N_Vector *)0x0 || order < 1) || iVar3 != 0) {
    return -0x16;
  }
  uVar5 = (ulong)(uint)order;
  uVar4 = 0;
  do {
    if (uVar5 == uVar4) {
      uVar7 = (ulong)(order + 1);
      uVar4 = 0;
      do {
        if (uVar7 == uVar4) {
          local_70 = hscale;
          if (1 < order) {
            dVar2 = *t;
            for (uVar4 = 1; uVar7 != uVar4; uVar4 = uVar4 + 1) {
              t_ext[uVar4] = t[uVar4 - 1];
            }
            t_ext[0] = dVar2;
            N_VScale(0x3ff0000000000000,*y,*wrk);
            for (lVar8 = 0; uVar7 - 1 != lVar8; lVar8 = lVar8 + 1) {
              N_VScale(0x3ff0000000000000,y[lVar8],wrk[lVar8 + 1]);
            }
            psVar6 = &local_70;
            for (uVar4 = 1; uVar9 = uVar5, uVar4 != uVar7; uVar4 = uVar4 + 1) {
              for (; (long)uVar4 <= (long)uVar9; uVar9 = uVar9 - 1) {
                if (uVar9 == 1) {
                  N_VScale(0x3ff0000000000000,f,wrk[1]);
                }
                else {
                  dVar10 = 1.0 / (psVar6[uVar9] - t_ext[uVar9]);
                  N_VLinearSum(dVar10,-dVar10,wrk[uVar9 - 1],wrk[uVar9]);
                }
              }
              psVar6 = psVar6 + -1;
            }
            N_VScale(0x3ff0000000000000,wrk[uVar5],*zn);
            for (uVar4 = 1; uVar7 != uVar4; uVar4 = uVar4 + 1) {
              N_VConst(zn[uVar4]);
            }
            while (0 < (long)uVar9) {
              uVar9 = uVar9 - 1;
              dVar10 = t_ext[uVar9];
              for (uVar4 = uVar5; 0 < (long)uVar4; uVar4 = uVar4 - 1) {
                N_VLinearSum(dVar2 - dVar10,(double)(int)uVar4,zn[uVar4],zn[uVar4 - 1],zn[uVar4]);
              }
              N_VLinearSum(dVar2 - t_ext[uVar9],0x3ff0000000000000,*zn,wrk[uVar9],*zn);
            }
          }
          N_VScale(0x3ff0000000000000,*y,*zn);
          N_VScale(0x3ff0000000000000,f,zn[1]);
          for (uVar4 = 1; uVar7 != uVar4; uVar4 = uVar4 + 1) {
            N_VScale(zn[uVar4],zn[uVar4]);
          }
          return 0;
        }
        pp_Var1 = wrk + uVar4;
        uVar4 = uVar4 + 1;
      } while (*pp_Var1 != (N_Vector)0x0);
      return -0x16;
    }
    pp_Var1 = y + uVar4;
    uVar4 = uVar4 + 1;
  } while (*pp_Var1 != (N_Vector)0x0);
  return -0x16;
}

Assistant:

static int cvBuildNordsieckArrayBDF(sunrealtype* t, N_Vector* y, N_Vector f,
                                    N_Vector* wrk, int order,
                                    sunrealtype hscale, N_Vector* zn)
{
  /* Check for valid inputs */
  if (!t || !y || !f || !wrk || order < 1 || !zn) { return CV_ILL_INPUT; }

  for (int i = 0; i < order; i++)
  {
    if (!y[i]) { return CV_ILL_INPUT; }
  }

  for (int i = 0; i < order + 1; i++)
  {
    if (!wrk[i]) { return CV_ILL_INPUT; }
  }

  /* Compute Nordsieck array */
  if (order > 1)
  {
    /* Setup extended array of times to incorporate derivative value */
    sunrealtype t_ext[BDF_Q_MAX + 1];

    t_ext[0] = t[0];
    for (int i = 1; i <= order; i++) { t_ext[i] = t[i - 1]; }

    /* Compute Hermite polynomial coefficients interpolating y history and f */
    N_VScale(ONE, y[0], wrk[0]);
    for (int i = 1; i <= order; i++) { N_VScale(ONE, y[i - 1], wrk[i]); }

    for (int i = 1; i <= order; i++)
    {
      for (int j = order; j > i - 1; j--)
      {
        if (i == 1 && j == 1)
        {
          /* Replace with actual derivative value */
          N_VScale(ONE, f, wrk[j]);
        }
        else
        {
          /* Divided difference */
          sunrealtype delta_t = ONE / (t_ext[j - i] - t_ext[j]);
          N_VLinearSum(delta_t, wrk[j - 1], -delta_t, wrk[j], wrk[j]);
        }
      }
    }

    /* Compute derivatives of Hermite polynomial */
    N_VScale(ONE, wrk[order], zn[0]);
    for (int i = 1; i <= order; i++) { N_VConst(ZERO, zn[i]); }

    for (int i = order - 1; i >= 0; i--)
    {
      for (int j = order; j > 0; j--)
      {
        N_VLinearSum(t_ext[0] - t_ext[i], zn[j], j, zn[j - 1], zn[j]);
      }
      N_VLinearSum(t_ext[0] - t_ext[i], zn[0], ONE, wrk[i], zn[0]);
    }
  }

  /* Overwrite first two columns with input values */
  N_VScale(ONE, y[0], zn[0]);
  N_VScale(ONE, f, zn[1]);

  /* Scale entries */
  sunrealtype scale = ONE;
  for (int i = 1; i <= order; i++)
  {
    scale *= hscale / ((sunrealtype)i);
    N_VScale(scale, zn[i], zn[i]);
  }

  return CV_SUCCESS;
}